

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Int FT_Face_GetCharVariantIsDefault(FT_Face face,FT_ULong charcode,FT_ULong variantSelector)

{
  FT_CharMap pFVar1;
  FT_CMap_conflict vcmap;
  FT_CharMap charmap;
  FT_Int result;
  FT_ULong variantSelector_local;
  FT_ULong charcode_local;
  FT_Face face_local;
  
  charmap._4_4_ = -1;
  if ((face != (FT_Face)0x0) &&
     (pFVar1 = find_variant_selector_charmap(face), pFVar1 != (FT_CharMap)0x0)) {
    charmap._4_4_ =
         (*(code *)(pFVar1[1].face)->style_name)
                   (pFVar1,charcode & 0xffffffff,variantSelector & 0xffffffff);
  }
  return charmap._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Int )
  FT_Face_GetCharVariantIsDefault( FT_Face   face,
                                   FT_ULong  charcode,
                                   FT_ULong  variantSelector )
  {
    FT_Int  result = -1;


    if ( face )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );


      if ( charmap )
      {
        FT_CMap  vcmap = FT_CMAP( charmap );


        if ( charcode > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIsDefault:"
                      " too large charcode" ));
          FT_TRACE1(( " 0x%lx is truncated\n", charcode ));
        }
        if ( variantSelector > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIsDefault:"
                      " too large variantSelector" ));
          FT_TRACE1(( " 0x%lx is truncated\n", variantSelector ));
        }

        result = vcmap->clazz->char_var_default( vcmap,
                                                 (FT_UInt32)charcode,
                                                 (FT_UInt32)variantSelector );
      }
    }

    return result;
  }